

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

int correct_branch_type(tmpbranch *tbr)

{
  tmpbranch *tbr_local;
  
  switch(tbr->type) {
  case 0:
    tbr_local._4_4_ = 0;
    break;
  case 1:
    tbr_local._4_4_ = 2;
    if (tbr->up != 0) {
      tbr_local._4_4_ = 1;
    }
    break;
  case 2:
    tbr_local._4_4_ = 1;
    if (tbr->up != 0) {
      tbr_local._4_4_ = 2;
    }
    break;
  case 3:
    tbr_local._4_4_ = 3;
    break;
  default:
    impossible("correct_branch_type: unknown branch type");
    tbr_local._4_4_ = 0;
  }
  return tbr_local._4_4_;
}

Assistant:

static int correct_branch_type(struct tmpbranch *tbr)
{
    switch (tbr->type) {
	case TBR_STAIR:		return BR_STAIR;
	case TBR_NO_UP:		return tbr->up ? BR_NO_END1 : BR_NO_END2;
	case TBR_NO_DOWN:	return tbr->up ? BR_NO_END2 : BR_NO_END1;
	case TBR_PORTAL:	return BR_PORTAL;
    }
    impossible("correct_branch_type: unknown branch type");
    return BR_STAIR;
}